

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkExecEntry(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  TimeDependencies *this_00;
  int32_t *piVar1;
  TimeState TVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  pointer pDVar6;
  bool bVar7;
  byte bVar8;
  uint8_t uVar9;
  int iVar10;
  Time TVar11;
  long lVar12;
  DependencyInfo *pDVar13;
  DependencyInfo *pDVar14;
  int32_t responseSequenceCounter;
  byte bVar15;
  GlobalFederateId GVar16;
  MessageProcessingResult MVar17;
  byte bVar18;
  action_t startingAction;
  ActionMessage *pAVar19;
  pointer pDVar20;
  TimeData *pTVar21;
  char cVar22;
  TimeDependencies *__range5;
  byte bVar23;
  ActionMessage execgrant;
  ActionMessage AStack_e8;
  
  bVar23 = 0;
  if ((this->time_block).internalTimeCode < 1) {
    return CONTINUE_PROCESSING;
  }
  this_00 = &(this->super_BaseTimeCoordinator).dependencies;
  bVar7 = TimeDependencies::checkIfReadyForExecEntry
                    (this_00,this->iterating != NO_ITERATIONS,
                     (this->info).wait_for_current_time_updates);
  if (!bVar7) {
    if (this->iterating == NO_ITERATIONS) {
      return CONTINUE_PROCESSING;
    }
    if (this->hasInitUpdates != false) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -2010000000) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -1700000000) {
      return CONTINUE_PROCESSING;
    }
    bVar7 = TimeDependencies::checkIfReadyForExecEntry(this_00,false,false);
    if (!bVar7) {
      this->needSendAll = true;
      return CONTINUE_PROCESSING;
    }
    pDVar13 = getExecEntryMinFederate
                        (this_00,(GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                         NONE,(GlobalFederateId)0x8831d580);
    if (((pDVar13->fedID).gid != triggerFed.gid) &&
       (pDVar13 = TimeDependencies::getDependencyInfo(this_00,triggerFed),
       pDVar13->dependent != true)) {
      return CONTINUE_PROCESSING;
    }
    responseSequenceCounter = (pDVar13->super_TimeData).sequenceCounter;
    GVar16.gid = -2010000000;
    goto LAB_003495b1;
  }
  cVar22 = this->needSendAll;
  this->needSendAll = false;
  MVar17 = CONTINUE_PROCESSING;
  if (this->iterating - 1 < 2) {
    if ((this->iteration).super___atomic_base<int>._M_i < (this->info).maxIterations) {
      if (this->hasInitUpdates != false) {
        MVar17 = ITERATING;
        goto LAB_00349319;
      }
      bVar7 = TimeDependencies::checkIfReadyForExecEntry
                        (this_00,false,(this->info).wait_for_current_time_updates);
      if (!bVar7) {
        bVar23 = (this->info).wait_for_current_time_updates;
        if ((bool)bVar23 == true) {
          bVar7 = TimeDependencies::checkIfAllDependenciesArePastExec(this_00,true);
          if (bVar7) goto LAB_0034930a;
          bVar23 = (this->info).wait_for_current_time_updates;
        }
        bVar15 = bVar23 ^ 1;
        bVar7 = (this->info).restrictive_time_policy;
        bVar8 = 0x32;
        bVar18 = bVar7;
        if ((bVar23 & 1) == 0) {
          pDVar20 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar6 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                   super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pDVar20 != pDVar6) {
            iVar10 = (this->super_BaseTimeCoordinator).sequenceCounter;
            bVar23 = bVar15;
            do {
              if (pDVar20->dependency == true) {
                TVar2 = (pDVar20->super_TimeData).mTimeState;
                if (TVar2 == initialized) goto LAB_00349319;
                if (TVar2 < exec_requested) {
                  iVar4 = (pDVar20->super_TimeData).responseSequenceCounter;
                  bVar15 = bVar23;
                  if ((pDVar20->super_TimeData).minFed.gid !=
                      (this->super_BaseTimeCoordinator).mSourceId.gid) {
                    bVar15 = 0;
                  }
                  bVar23 = bVar15;
                  if ((iVar4 == iVar10 & bVar7) == 1) {
                    bVar3 = (pDVar20->super_TimeData).restrictionLevel;
                    if (bVar3 <= bVar8) {
                      bVar8 = bVar3;
                    }
                  }
                  else if (iVar4 != iVar10) {
                    bVar15 = 0;
                    bVar18 = 0;
                    break;
                  }
                }
              }
              pDVar20 = pDVar20 + 1;
            } while (pDVar20 != pDVar6);
          }
        }
        if ((bVar15 & 1) == 0) {
          if (bVar18 != 0) {
            uVar9 = bVar8 + 1;
LAB_003496b6:
            this->currentRestrictionLevel = uVar9;
            piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
            *piVar1 = *piVar1 + 1;
            cVar22 = '\x01';
          }
        }
        else {
          if ((bVar7 == false) || (bVar8 != 0)) goto LAB_0034930a;
          uVar9 = '\x01';
          if (this->currentRestrictionLevel != '\x01') goto LAB_003496b6;
        }
        goto LAB_00349319;
      }
    }
LAB_0034930a:
    MVar17 = (this->iterating == FORCE_ITERATION) * '\x02';
LAB_00349319:
    if (this->dynamicJoining == false) {
      if (MVar17 == ITERATING) {
        TimeDependencies::resetIteratingExecRequests(this_00);
        this->hasInitUpdates = false;
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i =
             (this->iteration).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        ActionMessage::ActionMessage(&AStack_e8,cmd_exec_grant);
        AStack_e8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
        AStack_e8.counter = (uint16_t)(this->iteration).super___atomic_base<int>._M_i;
        AStack_e8.source_handle.hid = 1;
        AStack_e8.flags._0_1_ = (byte)AStack_e8.flags | 1;
        transmitTimingMessages(this,&AStack_e8,(GlobalFederateId)0x8831d580);
        this->currentRestrictionLevel = '\0';
        ActionMessage::~ActionMessage(&AStack_e8);
        MVar17 = ITERATING;
      }
      else if (MVar17 == NEXT_STEP) {
LAB_00349440:
        (this->time_granted).internalTimeCode = 0;
        (this->time_grantBase).internalTimeCode = 0;
        (this->super_BaseTimeCoordinator).executionMode = true;
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i = 0;
        UNLOCK();
        this->currentRestrictionLevel = '\0';
        ActionMessage::ActionMessage(&AStack_e8,cmd_exec_grant);
        AStack_e8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
        AStack_e8.source_handle.hid = 1;
        transmitTimingMessages(this,&AStack_e8,(GlobalFederateId)0x8831d580);
        goto LAB_003494fa;
      }
    }
    else if (MVar17 == NEXT_STEP) goto LAB_003493c7;
  }
  else {
    if (this->iterating != NO_ITERATIONS) goto LAB_00349319;
    if ((this->info).wait_for_current_time_updates == true) {
      GVar16.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      generateMinTimeTotal
                ((TimeData *)&AStack_e8,this_00,
                 (bool)((this->globalTime | (this->info).restrictive_time_policy) & 1),GVar16,GVar16
                 ,(this->super_BaseTimeCoordinator).sequenceCounter);
      pAVar19 = &AStack_e8;
      pTVar21 = &this->total;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pTVar21->next).internalTimeCode = *(baseType *)pAVar19;
        pAVar19 = (ActionMessage *)((long)pAVar19 + ((ulong)bVar23 * -2 + 1) * 8);
        pTVar21 = (TimeData *)((long)pTVar21 + (ulong)bVar23 * -0x10 + 8);
      }
      MVar17 = (0 < (this->total).next.internalTimeCode) * '\x02' + CONTINUE_PROCESSING;
      goto LAB_00349319;
    }
    if (this->dynamicJoining == false) goto LAB_00349440;
LAB_003493c7:
    (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])(this);
    iVar10 = BaseTimeCoordinator::dependencyCount(&this->super_BaseTimeCoordinator);
    if (iVar10 < 1) {
      (this->time_granted).internalTimeCode = 0;
      (this->time_grantBase).internalTimeCode = 0;
      (this->super_BaseTimeCoordinator).executionMode = true;
      LOCK();
      (this->iteration).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      this->currentRestrictionLevel = '\0';
      startingAction = cmd_exec_grant;
    }
    else {
      TVar11 = generateAllowedTime(this,(this->total).next.internalTimeCode);
      lVar12 = (this->info).timeDelta.internalTimeCode;
      lVar5 = (this->info).period.internalTimeCode;
      if (lVar12 < lVar5) {
        lVar12 = lVar5;
      }
      lVar12 = TVar11.internalTimeCode - lVar12;
      (this->time_granted).internalTimeCode = lVar12;
      (this->time_grantBase).internalTimeCode = lVar12;
      (this->super_BaseTimeCoordinator).executionMode = true;
      LOCK();
      (this->iteration).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      this->currentRestrictionLevel = '\0';
      startingAction = cmd_exec_grant;
      if (0 < lVar12) {
        startingAction = cmd_time_grant;
      }
    }
    ActionMessage::ActionMessage(&AStack_e8,startingAction);
    AStack_e8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    AStack_e8.actionTime.internalTimeCode = (this->time_granted).internalTimeCode;
    AStack_e8.source_handle.hid = 1;
    transmitTimingMessages(this,&AStack_e8,(GlobalFederateId)0x8831d580);
LAB_003494fa:
    ActionMessage::~ActionMessage(&AStack_e8);
    MVar17 = NEXT_STEP;
  }
  if (triggerFed.gid == -2010000000) {
    return MVar17;
  }
  if (triggerFed.gid == -1700000000) {
    return MVar17;
  }
  if (MVar17 != CONTINUE_PROCESSING) {
    return MVar17;
  }
  if (this->iterating == NO_ITERATIONS) {
    return CONTINUE_PROCESSING;
  }
  pDVar13 = getExecEntryMinFederate
                      (this_00,(GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                       NONE,(GlobalFederateId)0x8831d580);
  if (cVar22 != '\0') {
    sendUpdatedExecRequest
              (this,(GlobalFederateId)0x8831d580,(GlobalFederateId)(pDVar13->fedID).gid,
               (pDVar13->super_TimeData).sequenceCounter);
    return CONTINUE_PROCESSING;
  }
  if ((this->super_BaseTimeCoordinator).mSourceId.gid == triggerFed.gid) {
    return CONTINUE_PROCESSING;
  }
  if (((pDVar13->fedID).gid == triggerFed.gid) && (pDVar13->dependent == true)) {
    responseSequenceCounter = (pDVar13->super_TimeData).sequenceCounter;
    GVar16.gid = triggerFed.gid;
  }
  else {
    pDVar14 = TimeDependencies::getDependencyInfo(this_00,triggerFed);
    if (pDVar14->dependent != true) {
      return CONTINUE_PROCESSING;
    }
    GVar16.gid = (pDVar13->fedID).gid;
    responseSequenceCounter = (pDVar14->super_TimeData).sequenceCounter;
  }
LAB_003495b1:
  sendUpdatedExecRequest(this,triggerFed,GVar16,responseSequenceCounter);
  return CONTINUE_PROCESSING;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkExecEntry(GlobalFederateId triggerFed)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (time_block <= timeZero) {
        return ret;
    }
    if (!dependencies.checkIfReadyForExecEntry(iterating != IterationRequest::NO_ITERATIONS,
                                               info.wait_for_current_time_updates)) {
        if (!hasInitUpdates) {
            if (triggerFed.isValid() && iterating != IterationRequest::NO_ITERATIONS) {
                if (dependencies.checkIfReadyForExecEntry(false, false)) {
                    // if we are just continuing but would have granted in other circumstances
                    const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
                    if (mfed.fedID == triggerFed) {
                        sendUpdatedExecRequest(triggerFed,
                                               GlobalFederateId{},
                                               mfed.sequenceCounter);
                    } else {
                        const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                        if (tfed->dependent) {
                            sendUpdatedExecRequest(triggerFed,
                                                   GlobalFederateId{},
                                                   tfed->sequenceCounter);
                        }
                    }
                } else {
                    needSendAll = true;
                }
            }
        }
        return ret;
    }
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (!info.wait_for_current_time_updates) {
                ret = MessageProcessingResult::NEXT_STEP;
            } else {
                // on wait for current time flag all other federates must have entered exec mode
                total = generateMinTimeTotal(dependencies,
                                             info.restrictive_time_policy || globalTime,
                                             mSourceId,
                                             mSourceId,
                                             sequenceCounter);
                if (total.next > timeZero) {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (iteration >= info.maxIterations) {
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ret = MessageProcessingResult::ITERATING;
                } else {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
                break;
            }
            if (hasInitUpdates) {
                ret = MessageProcessingResult::ITERATING;
            } else {
                if ((dependencies.checkIfReadyForExecEntry(false,
                                                           info.wait_for_current_time_updates)) ||
                    (info.wait_for_current_time_updates &&
                     dependencies.checkIfAllDependenciesArePastExec(true))) {
                    ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                        MessageProcessingResult::ITERATING :
                        MessageProcessingResult::NEXT_STEP;
                } else {
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.mTimeState == TimeState::initialized) {
                                allowed = false;
                                restrictionAdvance = false;
                                break;
                            }
                            if (dep.mTimeState >= TimeState::exec_requested) {
                                continue;
                            }
                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                    MessageProcessingResult::ITERATING :
                                    MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                MessageProcessingResult::ITERATING :
                                MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }
            break;
        default:
            break;
    }
    if (!dynamicJoining) {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            time_granted = timeZero;
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        } else if (ret == MessageProcessingResult::ITERATING) {
            dependencies.resetIteratingExecRequests();
            hasInitUpdates = false;
            ++iteration;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.counter = iteration;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            setActionFlag(execgrant, iteration_requested_flag);
            transmitTimingMessages(execgrant);
            currentRestrictionLevel = 0;
        }
    } else {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            updateTimeFactors();
            if (dependencyCount() > 0) {
                time_granted =
                    generateAllowedTime(total.next) - (std::max)(info.period, info.timeDelta);
            } else {
                time_granted = timeZero;
            }
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(time_granted > timeZero ? CMD_TIME_GRANT : CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.actionTime = time_granted;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        }
    }
    if (triggerFed.isValid() && ret == MessageProcessingResult::CONTINUE_PROCESSING &&
        iterating != IterationRequest::NO_ITERATIONS) {
        // if we are just continuing
        const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
        if (sendAll) {
            sendUpdatedExecRequest(GlobalFederateId{}, mfed.fedID, mfed.sequenceCounter);
        } else {
            if (triggerFed != mSourceId) {
                if (triggerFed == mfed.fedID && mfed.dependent) {
                    sendUpdatedExecRequest(triggerFed, mfed.fedID, mfed.sequenceCounter);
                } else {
                    const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                    if (tfed->dependent) {
                        sendUpdatedExecRequest(triggerFed, mfed.fedID, tfed->sequenceCounter);
                    }
                }
            }
        }
    }
    return ret;
}